

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  long *plVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined8 uVar13;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 uVar25;
  int *piVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  vector<float,_std::allocator<float>_> *pvVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int iVar32;
  undefined4 extraout_var;
  int iVar33;
  _func_int *p_Var34;
  uint uVar35;
  Layer *pLVar36;
  Option *opt_00;
  ConvolutionDepthWise_x86 *pCVar37;
  long lVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  Mat local_238;
  void *local_1f0;
  int *local_1e8;
  Option *local_1e0;
  int local_1d8;
  Allocator *local_1d0;
  undefined4 local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  ulong local_1b8;
  Mat *local_1b0;
  void *ptr;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  int iStack_190;
  undefined4 uStack_18c;
  Allocator *local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  ulong uStack_170;
  Option *local_168;
  long local_160;
  Option opt_g;
  Mat local_108;
  Option opt_g_1;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  undefined3 uVar22;
  undefined2 uVar24;
  
  iVar1 = bottom_blob->c;
  p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if (iVar1 % *(int *)(&this->field_0xb8 + (long)p_Var34) != 0) {
    return -100;
  }
  if (*(int *)(&this->field_0x80 + (long)p_Var34) % *(int *)(&this->field_0xb8 + (long)p_Var34) != 0
     ) {
    return -100;
  }
  iVar33 = bottom_blob->w;
  iVar39 = bottom_blob->h;
  opt_00 = (Option *)bottom_blob->elemsize;
  local_160 = CONCAT44(local_160._4_4_,
                       (*(int *)(&this->field_0x84 + (long)p_Var34) + -1) *
                       *(int *)(&this->field_0x8c + (long)p_Var34));
  uVar35 = (*(int *)(&this->field_0x88 + (long)p_Var34) + -1) *
           *(int *)(&this->field_0x90 + (long)p_Var34);
  local_108.data = bottom_blob->data;
  local_108.refcount = bottom_blob->refcount;
  local_108.elempack = bottom_blob->elempack;
  local_108.allocator = bottom_blob->allocator;
  local_108.dims = bottom_blob->dims;
  local_108.w = bottom_blob->w;
  local_108.c = iVar1;
  local_108.h = iVar39;
  local_108.cstep = bottom_blob->cstep;
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + 1;
    UNLOCK();
    p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
  }
  local_1b0 = top_blob;
  local_168 = opt;
  local_108.elemsize = (size_t)opt_00;
  uVar30 = local_108._40_8_;
  uVar31 = local_108._48_8_;
  if ((opt_00 != (Option *)0x1 & (&this->field_0x20c)[(long)p_Var34]) == 1) {
    local_238.allocator = opt->workspace_allocator;
    local_238.data = (void *)0x0;
    local_238.refcount = (int *)0x0;
    local_238.elemsize = 1;
    local_238.elempack = 1;
    local_238.w = iVar33;
    local_238.dims = 3;
    local_238.c = iVar1;
    local_238.h = iVar39;
    local_238.cstep = (long)(iVar39 * iVar33) + 0xfU & 0xfffffffffffffff0;
    uVar40 = local_238.cstep * (long)iVar1;
    if (uVar40 == 0) {
      iVar33 = -100;
      goto LAB_00160404;
    }
    if (local_238.allocator == (Allocator *)0x0) {
      ptr = (void *)0x0;
      iVar32 = posix_memalign(&ptr,0x10,uVar40 | 4);
      local_238.data = (void *)0x0;
      if (iVar32 == 0) {
        local_238.data = ptr;
      }
    }
    else {
      iVar32 = (*(local_238.allocator)->_vptr_Allocator[2])(local_238.allocator,uVar40 | 4);
      local_238.data = (void *)CONCAT44(extraout_var,iVar32);
    }
    local_238.refcount = (int *)((long)local_238.data + uVar40);
    *(undefined4 *)((long)local_238.data + uVar40) = 1;
    pp_Var5 = this->_vptr_ConvolutionDepthWise_x86;
    iVar32 = iVar1 / *(int *)(&this->field_0xb8 + (long)pp_Var5[-3]);
    if (*(int *)(&this->field_0xb8 + (long)pp_Var5[-3]) < 1) {
LAB_0015f4db:
      LOCK();
      *local_238.refcount = *local_238.refcount + 1;
      UNLOCK();
    }
    else {
      lVar41 = 0;
      lVar38 = 0;
      do {
        opt_g.workspace_allocator = local_168->workspace_allocator;
        opt_g.use_winograd_convolution = local_168->use_winograd_convolution;
        opt_g.use_sgemm_convolution = local_168->use_sgemm_convolution;
        opt_g.use_int8_inference = local_168->use_int8_inference;
        opt_g.use_vulkan_compute = local_168->use_vulkan_compute;
        opt_g.use_fp16_packed = local_168->use_fp16_packed;
        opt_g.use_fp16_storage = local_168->use_fp16_storage;
        opt_g.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
        opt_g.use_int8_storage = local_168->use_int8_storage;
        opt_g.use_int8_arithmetic = local_168->use_int8_arithmetic;
        opt_g.use_packing_layout = local_168->use_packing_layout;
        opt_g._34_6_ = *(undefined6 *)&local_168->field_0x22;
        opt_g.num_threads = 1;
        opt_g.lightmode = local_168->lightmode;
        opt_g._1_3_ = *(undefined3 *)&local_168->field_0x1;
        opt_g.blob_allocator = local_238.allocator;
        uStack_170 = bottom_blob->elemsize;
        ptr = (void *)(bottom_blob->cstep * lVar41 * uStack_170 + (long)bottom_blob->data);
        iStack_190 = bottom_blob->elempack;
        local_188 = bottom_blob->allocator;
        uStack_1a0 = 0;
        uStack_19c = 0;
        local_198 = (undefined4)uStack_170;
        uStack_194 = (undefined4)(uStack_170 >> 0x20);
        uStack_180._4_4_ = bottom_blob->w;
        uStack_180._0_4_ = 3;
        local_178._4_4_ = iVar32;
        local_178._0_4_ = bottom_blob->h;
        uStack_170 = ((long)(bottom_blob->h * bottom_blob->w) * uStack_170 + 0xf &
                     0xfffffffffffffff0) / uStack_170;
        local_1f0 = (void *)(local_238.cstep * lVar41 * local_238.elemsize + (long)local_238.data);
        local_1e8 = (int *)0x0;
        local_1e0 = (Option *)local_238.elemsize;
        local_1d8 = local_238.elempack;
        local_1d0 = local_238.allocator;
        local_1c8 = 3;
        local_1c4 = local_238.w;
        local_1c0 = local_238.h;
        local_1b8 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                    0xfffffffffffffff0) / local_238.elemsize;
        plVar6 = *(long **)(*(long *)(&this->field_0x210 + (long)pp_Var5[-3]) + lVar38 * 8);
        local_1bc = iVar32;
        (**(code **)(*plVar6 + 0x38))(plVar6,&ptr,&local_1f0,&opt_g);
        if (local_1e8 != (int *)0x0) {
          LOCK();
          *local_1e8 = *local_1e8 + -1;
          UNLOCK();
          if (*local_1e8 == 0) {
            if (local_1d0 == (Allocator *)0x0) {
              if (local_1f0 != (void *)0x0) {
                free(local_1f0);
              }
            }
            else {
              (*local_1d0->_vptr_Allocator[3])();
            }
          }
        }
        piVar26 = (int *)CONCAT44(uStack_19c,uStack_1a0);
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_188 == (Allocator *)0x0) {
              if (ptr != (void *)0x0) {
                free(ptr);
              }
            }
            else {
              (*local_188->_vptr_Allocator[3])();
            }
          }
        }
        lVar38 = lVar38 + 1;
        pp_Var5 = this->_vptr_ConvolutionDepthWise_x86;
        lVar41 = lVar41 + iVar32;
      } while (lVar38 < *(int *)(&this->field_0xb8 + (long)pp_Var5[-3]));
      opt = local_168;
      if (local_238.refcount != (int *)0x0) goto LAB_0015f4db;
    }
    top_blob = local_1b0;
    if (local_108.refcount != (int *)0x0) {
      LOCK();
      *local_108.refcount = *local_108.refcount + -1;
      UNLOCK();
      if (*local_108.refcount == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_108.data = local_238.data;
    local_108.refcount = local_238.refcount;
    local_108.elemsize = local_238.elemsize;
    local_108.elempack = local_238.elempack;
    local_108.allocator = local_238.allocator;
    uVar27._0_4_ = local_238.dims;
    uVar27._4_4_ = local_238.w;
    local_108.dims = local_238.dims;
    local_108.w = local_238.w;
    uVar28._0_4_ = local_238.h;
    uVar28._4_4_ = local_238.c;
    local_108.h = local_238.h;
    local_108.c = local_238.c;
    local_108.cstep = local_238.cstep;
    uVar30 = uVar27;
    uVar31 = uVar28;
    if (local_238.refcount != (int *)0x0) {
      LOCK();
      *local_238.refcount = *local_238.refcount + -1;
      UNLOCK();
      uVar30 = local_108._40_8_;
      uVar31 = local_108._48_8_;
      if (*local_238.refcount == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            local_108._40_8_ = uVar27;
            local_108._48_8_ = uVar28;
            free(local_238.data);
            uVar30 = local_108._40_8_;
            uVar31 = local_108._48_8_;
          }
        }
        else {
          local_108._40_8_ = uVar27;
          local_108._48_8_ = uVar28;
          (*(local_238.allocator)->_vptr_Allocator[3])();
          uVar30 = local_108._40_8_;
          uVar31 = local_108._48_8_;
        }
      }
    }
  }
  local_108._48_8_ = uVar31;
  local_108._40_8_ = uVar30;
  local_238.data = local_108.data;
  local_238.refcount = local_108.refcount;
  local_238.elemsize = local_108.elemsize;
  local_238.elempack = local_108.elempack;
  local_238.allocator = local_108.allocator;
  local_238.dims = local_108.dims;
  local_238.w = local_108.w;
  local_238.h = local_108.h;
  local_238.c = local_108.c;
  local_238.cstep = local_108.cstep;
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + 1;
    UNLOCK();
  }
  pp_Var5 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var34 = pp_Var5[-3];
  iVar32 = *(int *)(&this->field_0x9c + (long)p_Var34);
  if ((((iVar32 < 1) && (iVar2 = *(int *)(&this->field_0xa0 + (long)p_Var34), iVar2 < 1)) &&
      (iVar3 = *(int *)(&this->field_0xa4 + (long)p_Var34), iVar3 < 1)) &&
     (iVar4 = *(int *)(&this->field_0xa8 + (long)p_Var34), iVar4 < 1)) {
    if (((iVar32 == -0xe9) && (iVar2 == -0xe9)) && ((iVar3 == -0xe9 && (iVar4 == -0xe9)))) {
      iVar32 = (uint)local_160 - (iVar33 + -1) % *(int *)(&this->field_0x94 + (long)p_Var34);
      iVar33 = uVar35 - (iVar39 + -1) % *(int *)(&this->field_0x98 + (long)p_Var34);
      if ((0 < iVar32) || (0 < iVar33)) {
        local_188 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        uVar13._0_1_ = opt->use_winograd_convolution;
        uVar13._1_1_ = opt->use_sgemm_convolution;
        uVar13._2_1_ = opt->use_int8_inference;
        uVar13._3_1_ = opt->use_vulkan_compute;
        uVar14 = opt->use_fp16_packed;
        uVar15 = opt->use_fp16_storage;
        uVar17 = opt->use_fp16_arithmetic;
        uVar19 = opt->use_int8_storage;
        uVar18 = CONCAT11(uVar19,uVar17);
        uVar16 = CONCAT21(uVar18,uVar15);
        uVar13._4_4_ = CONCAT31(uVar16,uVar14);
        local_198 = SUB84(opt->workspace_allocator,0);
        uStack_194 = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        iStack_190 = (int)uVar13;
        uStack_1a0 = SUB84(opt->workspace_allocator,0);
        uStack_19c = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        uStack_18c = uVar13._4_4_;
        copy_make_border(&local_108,&local_238,iVar33 / 2,iVar33 - iVar33 / 2,iVar32 / 2,
                         iVar32 - iVar32 / 2,0,*(float *)(&this->field_0xac + (long)pp_Var5[-3]),
                         (Option *)&ptr);
LAB_001603a2:
        if ((local_238.data == (void *)0x0) || ((long)local_238.c * local_238.cstep == 0))
        goto LAB_001603cb;
      }
    }
    else {
      if ((((iVar32 != -0xea) || (iVar2 != -0xea)) || (iVar3 != -0xea)) || (iVar4 != -0xea))
      goto LAB_0015f716;
      iVar32 = (uint)local_160 - (iVar33 + -1) % *(int *)(&this->field_0x94 + (long)p_Var34);
      iVar33 = uVar35 - (iVar39 + -1) % *(int *)(&this->field_0x98 + (long)p_Var34);
      if ((0 < iVar32) || (0 < iVar33)) {
        local_188 = *(Allocator **)&opt->use_int8_arithmetic;
        ptr = *(void **)opt;
        uVar31._0_1_ = opt->use_winograd_convolution;
        uVar31._1_1_ = opt->use_sgemm_convolution;
        uVar31._2_1_ = opt->use_int8_inference;
        uVar31._3_1_ = opt->use_vulkan_compute;
        uVar20 = opt->use_fp16_packed;
        uVar21 = opt->use_fp16_storage;
        uVar23 = opt->use_fp16_arithmetic;
        uVar25 = opt->use_int8_storage;
        uVar24 = CONCAT11(uVar25,uVar23);
        uVar22 = CONCAT21(uVar24,uVar21);
        uVar31._4_4_ = CONCAT31(uVar22,uVar20);
        local_198 = SUB84(opt->workspace_allocator,0);
        uStack_194 = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        iStack_190 = (int)uVar31;
        uStack_1a0 = SUB84(opt->workspace_allocator,0);
        uStack_19c = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        uStack_18c = uVar31._4_4_;
        copy_make_border(&local_108,&local_238,iVar33 - iVar33 / 2,iVar33 / 2,iVar32 - iVar32 / 2,
                         iVar32 / 2,0,*(float *)(&this->field_0xac + (long)pp_Var5[-3]),
                         (Option *)&ptr);
        goto LAB_001603a2;
      }
    }
    iVar33 = local_238.w;
    iVar39 = local_238.h;
LAB_0015f716:
    p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
    iVar32 = (int)(~(uint)local_160 + iVar33) / *(int *)(&this->field_0x94 + (long)p_Var34) + 1;
    iVar39 = (int)(~uVar35 + iVar39) / *(int *)(&this->field_0x98 + (long)p_Var34) + 1;
    if ((&this->field_0x20c)[(long)p_Var34] == '\x01') {
      if ((&this->field_0x20d)[(long)p_Var34] == '\x01') {
        local_198 = 0;
        uStack_194 = 0;
        iStack_190 = 0;
        ptr = (void *)0x0;
        uStack_1a0 = 0;
        uStack_19c = 0;
        local_188 = (Allocator *)0x0;
        uStack_180._0_4_ = 0;
        uStack_180._4_4_ = 0;
        local_178._0_4_ = 0;
        local_178._4_4_ = 0;
        uStack_170 = 0;
        Mat::create((Mat *)&ptr,iVar32,iVar39,
                    *(int *)(&this->field_0x80 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]),4,
                    opt->workspace_allocator);
        iVar33 = -100;
        if (((ptr != (void *)0x0) && ((long)local_178._4_4_ * uStack_170 != 0)) &&
           ((Mat::create(top_blob,iVar32,iVar39,
                         *(int *)(&this->field_0x80 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                 ),1,opt->blob_allocator), top_blob->data != (void *)0x0 &&
            ((long)top_blob->c * top_blob->cstep != 0)))) {
          p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
          iVar33 = *(int *)(&this->field_0x80 + (long)p_Var34);
          iVar39 = *(int *)(&this->field_0xb8 + (long)p_Var34);
          if (iVar1 != iVar33 || iVar1 != iVar39) {
            if (0 < iVar39) {
              local_160 = (long)(iVar1 / iVar39);
              lVar41 = 0;
              lVar42 = 0;
              lVar38 = 0;
              do {
                local_1f0 = (void *)(local_238.cstep * lVar41 * local_238.elemsize +
                                    (long)local_238.data);
                local_1e8 = (int *)0x0;
                local_1e0 = (Option *)local_238.elemsize;
                local_1d8 = local_238.elempack;
                local_1d0 = local_238.allocator;
                local_1c8 = 3;
                local_1c4 = local_238.w;
                local_1c0 = local_238.h;
                local_1b8 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                            0xfffffffffffffff0) / local_238.elemsize;
                opt_g.workspace_allocator = (Allocator *)CONCAT44(uStack_194,local_198);
                opt_g._0_8_ = uStack_170 * lVar42 * (long)opt_g.workspace_allocator + (long)ptr;
                opt_g.blob_allocator = (Allocator *)0x0;
                opt_g.use_winograd_convolution = (bool)(undefined1)iStack_190;
                opt_g.use_sgemm_convolution = (bool)iStack_190._1_1_;
                opt_g.use_int8_inference = (bool)iStack_190._2_1_;
                opt_g.use_vulkan_compute = (bool)iStack_190._3_1_;
                opt_g._32_8_ = local_188;
                pLVar36 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar38];
                opt_g_1.use_int8_arithmetic = local_168->use_int8_arithmetic;
                opt_g_1.use_packing_layout = local_168->use_packing_layout;
                opt_g_1._34_6_ = *(undefined6 *)&local_168->field_0x22;
                opt_g_1.lightmode = local_168->lightmode;
                opt_g_1._1_3_ = *(undefined3 *)&local_168->field_0x1;
                opt_g_1.num_threads = local_168->num_threads;
                opt_g_1.workspace_allocator._0_4_ = *(undefined4 *)&local_168->workspace_allocator;
                opt_g_1.workspace_allocator._4_4_ =
                     *(undefined4 *)((long)&local_168->workspace_allocator + 4);
                opt_g_1.use_winograd_convolution = local_168->use_winograd_convolution;
                opt_g_1.use_sgemm_convolution = local_168->use_sgemm_convolution;
                opt_g_1.use_int8_inference = local_168->use_int8_inference;
                opt_g_1.use_vulkan_compute = local_168->use_vulkan_compute;
                opt_g_1.use_fp16_packed = local_168->use_fp16_packed;
                opt_g_1.use_fp16_storage = local_168->use_fp16_storage;
                opt_g_1.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
                opt_g_1.use_int8_storage = local_168->use_int8_storage;
                opt_g_1.blob_allocator = local_1b0->allocator;
                local_1bc = iVar1 / iVar39;
                (*pLVar36->_vptr_Layer[7])(pLVar36,&local_1f0,&opt_g,&opt_g_1);
                if (opt_g.blob_allocator != (Allocator *)0x0) {
                  LOCK();
                  *(int *)&(opt_g.blob_allocator)->_vptr_Allocator =
                       *(int *)&(opt_g.blob_allocator)->_vptr_Allocator + -1;
                  UNLOCK();
                  if (*(int *)&(opt_g.blob_allocator)->_vptr_Allocator == 0) {
                    if (opt_g._32_8_ == 0) {
                      if (opt_g._0_8_ != 0) {
                        free((void *)opt_g._0_8_);
                      }
                    }
                    else {
                      (**(code **)(*(long *)opt_g._32_8_ + 0x18))();
                    }
                  }
                }
                if (local_1e8 != (int *)0x0) {
                  LOCK();
                  *local_1e8 = *local_1e8 + -1;
                  UNLOCK();
                  if (*local_1e8 == 0) {
                    if (local_1d0 == (Allocator *)0x0) {
                      if (local_1f0 != (void *)0x0) {
                        free(local_1f0);
                      }
                    }
                    else {
                      (*local_1d0->_vptr_Allocator[3])();
                    }
                  }
                }
                lVar38 = lVar38 + 1;
                lVar42 = lVar42 + iVar33 / iVar39;
                lVar41 = lVar41 + local_160;
              } while (lVar38 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            Mat::~Mat((Mat *)&ptr);
LAB_00160996:
            pLVar36 = this->activation;
            goto LAB_0016099a;
          }
          if ((((*(int *)(&this->field_0x84 + (long)p_Var34) == 3) &&
               (*(int *)(&this->field_0x88 + (long)p_Var34) == 3)) &&
              (*(int *)(&this->field_0x8c + (long)p_Var34) == 1)) &&
             (*(int *)(&this->field_0x90 + (long)p_Var34) == 1)) {
            if (*(int *)(&this->field_0x94 + (long)p_Var34) == 2) {
              if (*(int *)(&this->field_0x98 + (long)p_Var34) != 2) goto LAB_00160a31;
              pCVar37 = this;
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_60,
                         (vector<float,_std::allocator<float>_> *)
                         (&this->field_0x270 + (long)p_Var34));
              convdw3x3s2_int8_requant_sse
                        (&local_238,local_1b0,*(Mat **)(&this->field_0x108 + (long)p_Var34),
                         *(Mat **)(&this->field_0x148 + (long)p_Var34),&local_60,(Option *)pCVar37);
              if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                pvVar29 = &local_60;
                local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
                goto LAB_00160a19;
              }
            }
            else {
              if ((*(int *)(&this->field_0x94 + (long)p_Var34) != 1) ||
                 (*(int *)(&this->field_0x98 + (long)p_Var34) != 1)) goto LAB_00160a31;
              pCVar37 = this;
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_48,
                         (vector<float,_std::allocator<float>_> *)
                         (&this->field_0x270 + (long)p_Var34));
              convdw3x3s1_int8_requant_sse
                        (&local_238,local_1b0,*(Mat **)(&this->field_0x108 + (long)p_Var34),
                         *(Mat **)(&this->field_0x148 + (long)p_Var34),&local_48,(Option *)pCVar37);
              if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                pvVar29 = &local_48;
LAB_00160a19:
                operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)(pvVar29->super__Vector_base<float,_std::allocator<float>_>).
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            pLVar36 = this->activation;
          }
          else {
LAB_00160a31:
            if (0 < iVar1) {
              lVar38 = 0;
              do {
                local_1f0 = (void *)(local_238.cstep * lVar38 * local_238.elemsize +
                                    (long)local_238.data);
                local_1e8 = (int *)0x0;
                local_1e0 = (Option *)local_238.elemsize;
                local_1d8 = local_238.elempack;
                local_1d0 = local_238.allocator;
                local_1c8 = 3;
                local_1c4 = local_238.w;
                local_1c0 = local_238.h;
                local_1bc = 1;
                local_1b8 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                            0xfffffffffffffff0) / local_238.elemsize;
                opt_g.workspace_allocator = (Allocator *)CONCAT44(uStack_194,local_198);
                opt_g._0_8_ = uStack_170 * lVar38 * (long)opt_g.workspace_allocator + (long)ptr;
                opt_g.blob_allocator = (Allocator *)0x0;
                opt_g.use_winograd_convolution = (bool)(undefined1)iStack_190;
                opt_g.use_sgemm_convolution = (bool)iStack_190._1_1_;
                opt_g.use_int8_inference = (bool)iStack_190._2_1_;
                opt_g.use_vulkan_compute = (bool)iStack_190._3_1_;
                opt_g._32_8_ = local_188;
                pLVar36 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar38];
                opt_g_1.lightmode = local_168->lightmode;
                opt_g_1._1_3_ = *(undefined3 *)&local_168->field_0x1;
                opt_g_1.workspace_allocator._0_4_ = *(undefined4 *)&local_168->workspace_allocator;
                opt_g_1.workspace_allocator._4_4_ =
                     *(undefined4 *)((long)&local_168->workspace_allocator + 4);
                opt_g_1.use_winograd_convolution = local_168->use_winograd_convolution;
                opt_g_1.use_sgemm_convolution = local_168->use_sgemm_convolution;
                opt_g_1.use_int8_inference = local_168->use_int8_inference;
                opt_g_1.use_vulkan_compute = local_168->use_vulkan_compute;
                opt_g_1.use_fp16_packed = local_168->use_fp16_packed;
                opt_g_1.use_fp16_storage = local_168->use_fp16_storage;
                opt_g_1.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
                opt_g_1.use_int8_storage = local_168->use_int8_storage;
                opt_g_1.use_int8_arithmetic = local_168->use_int8_arithmetic;
                opt_g_1.use_packing_layout = local_168->use_packing_layout;
                opt_g_1._34_6_ = *(undefined6 *)&local_168->field_0x22;
                opt_g_1.num_threads = 1;
                opt_g_1.blob_allocator = local_1b0->allocator;
                (*pLVar36->_vptr_Layer[7])(pLVar36,&local_1f0,&opt_g,&opt_g_1);
                if (opt_g.blob_allocator != (Allocator *)0x0) {
                  LOCK();
                  *(int *)&(opt_g.blob_allocator)->_vptr_Allocator =
                       *(int *)&(opt_g.blob_allocator)->_vptr_Allocator + -1;
                  UNLOCK();
                  if (*(int *)&(opt_g.blob_allocator)->_vptr_Allocator == 0) {
                    if (opt_g._32_8_ == 0) {
                      if (opt_g._0_8_ != 0) {
                        free((void *)opt_g._0_8_);
                      }
                    }
                    else {
                      (**(code **)(*(long *)opt_g._32_8_ + 0x18))();
                    }
                  }
                }
                if (local_1e8 != (int *)0x0) {
                  LOCK();
                  *local_1e8 = *local_1e8 + -1;
                  UNLOCK();
                  if (*local_1e8 == 0) {
                    if (local_1d0 == (Allocator *)0x0) {
                      if (local_1f0 != (void *)0x0) {
                        free(local_1f0);
                      }
                    }
                    else {
                      (*local_1d0->_vptr_Allocator[3])();
                    }
                  }
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            pLVar36 = this->activation;
          }
          if (pLVar36 != (Layer *)0x0) {
            (*pLVar36->_vptr_Layer[9])(pLVar36,local_1b0,local_168);
          }
          iVar33 = 0;
        }
        Mat::~Mat((Mat *)&ptr);
      }
      else {
        Mat::create(top_blob,iVar32,iVar39,*(int *)(&this->field_0x80 + (long)p_Var34),4,
                    opt->blob_allocator);
        iVar33 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
          iVar33 = *(int *)(&this->field_0xb8 + (long)p_Var34);
          if (iVar1 != *(int *)(&this->field_0x80 + (long)p_Var34) || iVar1 != iVar33) {
            iVar39 = *(int *)(&this->field_0x80 + (long)p_Var34) / iVar33;
            if (0 < iVar33) {
              local_160 = (long)(iVar1 / iVar33);
              lVar42 = 0;
              lVar41 = 0;
              lVar38 = 0;
              do {
                ptr = (void *)(local_238.cstep * lVar42 * local_238.elemsize + (long)local_238.data)
                ;
                uStack_1a0 = 0;
                uStack_19c = 0;
                local_198 = (undefined4)local_238.elemsize;
                uStack_194 = (undefined4)(local_238.elemsize >> 0x20);
                iStack_190 = local_238.elempack;
                local_188 = local_238.allocator;
                uStack_180._4_4_ = local_238.w;
                uStack_180._0_4_ = 3;
                local_178._4_4_ = iVar1 / iVar33;
                local_178._0_4_ = local_238.h;
                uStack_170 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                             0xfffffffffffffff0) / local_238.elemsize;
                local_1c4 = local_1b0->w;
                local_1e0 = (Option *)local_1b0->elemsize;
                local_1f0 = (void *)(local_1b0->cstep * lVar41 * (long)local_1e0 +
                                    (long)local_1b0->data);
                local_1c0 = local_1b0->h;
                local_1d8 = local_1b0->elempack;
                local_1d0 = local_1b0->allocator;
                local_1e8 = (int *)0x0;
                local_1c8 = 3;
                local_1b8 = ((long)(local_1c0 * local_1c4) * (long)local_1e0 + 0xfU &
                            0xfffffffffffffff0) / (ulong)local_1e0;
                pLVar36 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar38];
                opt_g.lightmode = local_168->lightmode;
                opt_g._1_3_ = *(undefined3 *)&local_168->field_0x1;
                opt_g.num_threads = local_168->num_threads;
                opt_g.workspace_allocator = local_168->workspace_allocator;
                opt_g.use_winograd_convolution = local_168->use_winograd_convolution;
                opt_g.use_sgemm_convolution = local_168->use_sgemm_convolution;
                opt_g.use_int8_inference = local_168->use_int8_inference;
                opt_g.use_vulkan_compute = local_168->use_vulkan_compute;
                opt_g.use_fp16_packed = local_168->use_fp16_packed;
                opt_g.use_fp16_storage = local_168->use_fp16_storage;
                opt_g.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
                opt_g.use_int8_storage = local_168->use_int8_storage;
                opt_g.use_int8_arithmetic = local_168->use_int8_arithmetic;
                opt_g.use_packing_layout = local_168->use_packing_layout;
                opt_g._34_6_ = *(undefined6 *)&local_168->field_0x22;
                local_1bc = iVar39;
                opt_g.blob_allocator = local_1d0;
                (*pLVar36->_vptr_Layer[7])(pLVar36,&ptr,&local_1f0,&opt_g);
                if (local_1e8 != (int *)0x0) {
                  LOCK();
                  *local_1e8 = *local_1e8 + -1;
                  UNLOCK();
                  if (*local_1e8 == 0) {
                    if (local_1d0 == (Allocator *)0x0) {
                      if (local_1f0 != (void *)0x0) {
                        free(local_1f0);
                      }
                    }
                    else {
                      (*local_1d0->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar26 = (int *)CONCAT44(uStack_19c,uStack_1a0);
                if (piVar26 != (int *)0x0) {
                  LOCK();
                  *piVar26 = *piVar26 + -1;
                  UNLOCK();
                  if (*piVar26 == 0) {
                    if (local_188 == (Allocator *)0x0) {
                      if (ptr != (void *)0x0) {
                        free(ptr);
                      }
                    }
                    else {
                      (*local_188->_vptr_Allocator[3])();
                    }
                  }
                }
                lVar38 = lVar38 + 1;
                lVar41 = lVar41 + iVar39;
                lVar42 = lVar42 + local_160;
              } while (lVar38 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            goto LAB_00160996;
          }
          if ((((*(int *)(&this->field_0x84 + (long)p_Var34) != 3) ||
               (*(int *)(&this->field_0x88 + (long)p_Var34) != 3)) ||
              (*(int *)(&this->field_0x8c + (long)p_Var34) != 1)) ||
             (*(int *)(&this->field_0x90 + (long)p_Var34) != 1)) {
LAB_00160772:
            if (0 < iVar1) {
              lVar38 = 0;
              do {
                ptr = (void *)(local_238.cstep * lVar38 * local_238.elemsize + (long)local_238.data)
                ;
                uStack_1a0 = 0;
                uStack_19c = 0;
                local_198 = (undefined4)local_238.elemsize;
                uStack_194 = (undefined4)(local_238.elemsize >> 0x20);
                iStack_190 = local_238.elempack;
                local_188 = local_238.allocator;
                uStack_180._4_4_ = local_238.w;
                uStack_180._0_4_ = 3;
                local_178._4_4_ = 1;
                local_178._0_4_ = local_238.h;
                uStack_170 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                             0xfffffffffffffff0) / local_238.elemsize;
                local_1c4 = local_1b0->w;
                local_1c0 = local_1b0->h;
                local_1e0 = (Option *)local_1b0->elemsize;
                local_1f0 = (void *)(local_1b0->cstep * lVar38 * (long)local_1e0 +
                                    (long)local_1b0->data);
                local_1d8 = local_1b0->elempack;
                local_1d0 = local_1b0->allocator;
                local_1e8 = (int *)0x0;
                local_1c8 = 3;
                local_1bc = 1;
                local_1b8 = ((long)(local_1c0 * local_1c4) * (long)local_1e0 + 0xfU &
                            0xfffffffffffffff0) / (ulong)local_1e0;
                pLVar36 = (this->group_ops).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar38];
                opt_g.workspace_allocator = local_168->workspace_allocator;
                opt_g.use_winograd_convolution = local_168->use_winograd_convolution;
                opt_g.use_sgemm_convolution = local_168->use_sgemm_convolution;
                opt_g.use_int8_inference = local_168->use_int8_inference;
                opt_g.use_vulkan_compute = local_168->use_vulkan_compute;
                opt_g.use_fp16_packed = local_168->use_fp16_packed;
                opt_g.use_fp16_storage = local_168->use_fp16_storage;
                opt_g.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
                opt_g.use_int8_storage = local_168->use_int8_storage;
                opt_g.use_int8_arithmetic = local_168->use_int8_arithmetic;
                opt_g.use_packing_layout = local_168->use_packing_layout;
                opt_g._34_6_ = *(undefined6 *)&local_168->field_0x22;
                opt_g.num_threads = 1;
                opt_g.lightmode = local_168->lightmode;
                opt_g._1_3_ = *(undefined3 *)&local_168->field_0x1;
                opt_g.blob_allocator = local_1d0;
                (*pLVar36->_vptr_Layer[7])(pLVar36,&ptr,&local_1f0,&opt_g);
                if (local_1e8 != (int *)0x0) {
                  LOCK();
                  *local_1e8 = *local_1e8 + -1;
                  UNLOCK();
                  if (*local_1e8 == 0) {
                    if (local_1d0 == (Allocator *)0x0) {
                      if (local_1f0 != (void *)0x0) {
                        free(local_1f0);
                      }
                    }
                    else {
                      (*local_1d0->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar26 = (int *)CONCAT44(uStack_19c,uStack_1a0);
                if (piVar26 != (int *)0x0) {
                  LOCK();
                  *piVar26 = *piVar26 + -1;
                  UNLOCK();
                  if (*piVar26 == 0) {
                    if (local_188 == (Allocator *)0x0) {
                      if (ptr != (void *)0x0) {
                        free(ptr);
                      }
                    }
                    else {
                      (*local_188->_vptr_Allocator[3])();
                    }
                  }
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 < *(int *)(&this->field_0xb8 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
            }
            goto LAB_00160996;
          }
          if (*(int *)(&this->field_0x94 + (long)p_Var34) == 2) {
            if (*(int *)(&this->field_0x98 + (long)p_Var34) != 2) goto LAB_00160772;
            pCVar37 = this;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x258 + (long)p_Var34)
                      );
            convdw3x3s2_int8_dequant_sse
                      (&local_238,top_blob,*(Mat **)(&this->field_0x108 + (long)p_Var34),
                       *(Mat **)(&this->field_0x148 + (long)p_Var34),&local_90,(Option *)pCVar37);
            if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              pvVar29 = &local_90;
              local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              goto LAB_0016075a;
            }
          }
          else {
            if ((*(int *)(&this->field_0x94 + (long)p_Var34) != 1) ||
               (*(int *)(&this->field_0x98 + (long)p_Var34) != 1)) goto LAB_00160772;
            pCVar37 = this;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_78,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x258 + (long)p_Var34)
                      );
            convdw3x3s1_int8_dequant_sse
                      (&local_238,top_blob,*(Mat **)(&this->field_0x108 + (long)p_Var34),
                       *(Mat **)(&this->field_0x148 + (long)p_Var34),&local_78,(Option *)pCVar37);
            if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              pvVar29 = &local_78;
LAB_0016075a:
              operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)(pvVar29->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          pLVar36 = this->activation;
LAB_0016099a:
          if (pLVar36 != (Layer *)0x0) {
            (*pLVar36->_vptr_Layer[9])(pLVar36,local_1b0,local_168);
          }
          iVar33 = 0;
        }
      }
    }
    else {
      Mat::create(top_blob,iVar32,iVar39,*(int *)(&this->field_0x80 + (long)p_Var34),(size_t)opt_00,
                  opt->blob_allocator);
      iVar33 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
        iVar33 = *(int *)(&this->field_0xb8 + (long)p_Var34);
        if (iVar1 == *(int *)(&this->field_0x80 + (long)p_Var34) && iVar1 == iVar33) {
          if ((((*(int *)(&this->field_0x84 + (long)p_Var34) == 3) &&
               (*(int *)(&this->field_0x88 + (long)p_Var34) == 3)) &&
              (*(int *)(&this->field_0x8c + (long)p_Var34) == 1)) &&
             (*(int *)(&this->field_0x90 + (long)p_Var34) == 1)) {
            if (*(int *)(&this->field_0x94 + (long)p_Var34) == 2) {
              if (*(int *)(&this->field_0x98 + (long)p_Var34) == 2) {
                convdw3x3s2_sse(&local_238,top_blob,*(Mat **)(&this->field_0x108 + (long)p_Var34),
                                *(Mat **)(&this->field_0x148 + (long)p_Var34),opt_00);
              }
            }
            else if ((*(int *)(&this->field_0x94 + (long)p_Var34) == 1) &&
                    (*(int *)(&this->field_0x98 + (long)p_Var34) == 1)) {
              convdw3x3s1_sse(&local_238,top_blob,*(Mat **)(&this->field_0x108 + (long)p_Var34),
                              *(Mat **)(&this->field_0x148 + (long)p_Var34),opt_00);
            }
          }
          else if (0 < iVar1) {
            lVar38 = 0;
            do {
              ptr = (void *)(local_238.cstep * lVar38 * local_238.elemsize + (long)local_238.data);
              uStack_1a0 = 0;
              uStack_19c = 0;
              local_198 = (undefined4)local_238.elemsize;
              uStack_194 = (undefined4)(local_238.elemsize >> 0x20);
              iStack_190 = local_238.elempack;
              local_188 = local_238.allocator;
              uStack_180._4_4_ = local_238.w;
              uStack_180._0_4_ = 3;
              local_178._4_4_ = 1;
              local_178._0_4_ = local_238.h;
              uStack_170 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                           0xfffffffffffffff0) / local_238.elemsize;
              local_1c4 = local_1b0->w;
              local_1c0 = local_1b0->h;
              local_1e0 = (Option *)local_1b0->elemsize;
              local_1f0 = (void *)(local_1b0->cstep * lVar38 * (long)local_1e0 +
                                  (long)local_1b0->data);
              local_1d8 = local_1b0->elempack;
              local_1d0 = local_1b0->allocator;
              local_1e8 = (int *)0x0;
              local_1c8 = 3;
              local_1bc = 1;
              local_1b8 = ((long)(local_1c0 * local_1c4) * (long)local_1e0 + 0xfU &
                          0xfffffffffffffff0) / (ulong)local_1e0;
              pLVar36 = (this->group_ops).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar38];
              opt_g.workspace_allocator = local_168->workspace_allocator;
              opt_g.use_winograd_convolution = local_168->use_winograd_convolution;
              opt_g.use_sgemm_convolution = local_168->use_sgemm_convolution;
              opt_g.use_int8_inference = local_168->use_int8_inference;
              opt_g.use_vulkan_compute = local_168->use_vulkan_compute;
              opt_g.use_fp16_packed = local_168->use_fp16_packed;
              opt_g.use_fp16_storage = local_168->use_fp16_storage;
              opt_g.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
              opt_g.use_int8_storage = local_168->use_int8_storage;
              opt_g.use_int8_arithmetic = local_168->use_int8_arithmetic;
              opt_g.use_packing_layout = local_168->use_packing_layout;
              opt_g._34_6_ = *(undefined6 *)&local_168->field_0x22;
              opt_g.num_threads = 1;
              opt_g.lightmode = local_168->lightmode;
              opt_g._1_3_ = *(undefined3 *)&local_168->field_0x1;
              opt_g.blob_allocator = local_1d0;
              (*pLVar36->_vptr_Layer[7])(pLVar36,&ptr,&local_1f0,&opt_g);
              if (local_1e8 != (int *)0x0) {
                LOCK();
                *local_1e8 = *local_1e8 + -1;
                UNLOCK();
                if (*local_1e8 == 0) {
                  if (local_1d0 == (Allocator *)0x0) {
                    if (local_1f0 != (void *)0x0) {
                      free(local_1f0);
                    }
                  }
                  else {
                    (*local_1d0->_vptr_Allocator[3])();
                  }
                }
              }
              piVar26 = (int *)CONCAT44(uStack_19c,uStack_1a0);
              if (piVar26 != (int *)0x0) {
                LOCK();
                *piVar26 = *piVar26 + -1;
                UNLOCK();
                if (*piVar26 == 0) {
                  if (local_188 == (Allocator *)0x0) {
                    if (ptr != (void *)0x0) {
                      free(ptr);
                    }
                  }
                  else {
                    (*local_188->_vptr_Allocator[3])();
                  }
                }
              }
              lVar38 = lVar38 + 1;
            } while (lVar38 < *(int *)(&this->field_0xb8 +
                                      (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
          }
          goto LAB_00160996;
        }
        iVar39 = *(int *)(&this->field_0x80 + (long)p_Var34) / iVar33;
        if (0 < iVar33) {
          local_160 = (long)(iVar1 / iVar33);
          lVar42 = 0;
          lVar38 = 0;
          lVar41 = 0;
          do {
            ptr = (void *)(local_238.cstep * lVar42 * local_238.elemsize + (long)local_238.data);
            uStack_1a0 = 0;
            uStack_19c = 0;
            local_198 = (undefined4)local_238.elemsize;
            uStack_194 = (undefined4)(local_238.elemsize >> 0x20);
            iStack_190 = local_238.elempack;
            local_188 = local_238.allocator;
            uStack_180._4_4_ = local_238.w;
            uStack_180._0_4_ = 3;
            local_178._4_4_ = iVar1 / iVar33;
            local_178._0_4_ = local_238.h;
            uStack_170 = ((long)(local_238.h * local_238.w) * local_238.elemsize + 0xf &
                         0xfffffffffffffff0) / local_238.elemsize;
            local_1c4 = local_1b0->w;
            local_1e0 = (Option *)local_1b0->elemsize;
            local_1f0 = (void *)(local_1b0->cstep * lVar38 * (long)local_1e0 + (long)local_1b0->data
                                );
            local_1c0 = local_1b0->h;
            local_1d8 = local_1b0->elempack;
            local_1d0 = local_1b0->allocator;
            local_1e8 = (int *)0x0;
            local_1c8 = 3;
            local_1b8 = ((long)(local_1c0 * local_1c4) * (long)local_1e0 + 0xfU & 0xfffffffffffffff0
                        ) / (ulong)local_1e0;
            pLVar36 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar41];
            opt_g.lightmode = local_168->lightmode;
            opt_g._1_3_ = *(undefined3 *)&local_168->field_0x1;
            opt_g.num_threads = local_168->num_threads;
            opt_g.workspace_allocator = local_168->workspace_allocator;
            opt_g.use_winograd_convolution = local_168->use_winograd_convolution;
            opt_g.use_sgemm_convolution = local_168->use_sgemm_convolution;
            opt_g.use_int8_inference = local_168->use_int8_inference;
            opt_g.use_vulkan_compute = local_168->use_vulkan_compute;
            opt_g.use_fp16_packed = local_168->use_fp16_packed;
            opt_g.use_fp16_storage = local_168->use_fp16_storage;
            opt_g.use_fp16_arithmetic = local_168->use_fp16_arithmetic;
            opt_g.use_int8_storage = local_168->use_int8_storage;
            opt_g.use_int8_arithmetic = local_168->use_int8_arithmetic;
            opt_g.use_packing_layout = local_168->use_packing_layout;
            opt_g._34_6_ = *(undefined6 *)&local_168->field_0x22;
            local_1bc = iVar39;
            opt_g.blob_allocator = local_1d0;
            (*pLVar36->_vptr_Layer[7])(pLVar36,&ptr,&local_1f0,&opt_g);
            if (local_1e8 != (int *)0x0) {
              LOCK();
              *local_1e8 = *local_1e8 + -1;
              UNLOCK();
              if (*local_1e8 == 0) {
                if (local_1d0 == (Allocator *)0x0) {
                  if (local_1f0 != (void *)0x0) {
                    free(local_1f0);
                  }
                }
                else {
                  (*local_1d0->_vptr_Allocator[3])();
                }
              }
            }
            piVar26 = (int *)CONCAT44(uStack_19c,uStack_1a0);
            if (piVar26 != (int *)0x0) {
              LOCK();
              *piVar26 = *piVar26 + -1;
              UNLOCK();
              if (*piVar26 == 0) {
                if (local_188 == (Allocator *)0x0) {
                  if (ptr != (void *)0x0) {
                    free(ptr);
                  }
                }
                else {
                  (*local_188->_vptr_Allocator[3])();
                }
              }
            }
            lVar41 = lVar41 + 1;
            lVar38 = lVar38 + iVar39;
            lVar42 = lVar42 + local_160;
          } while (lVar41 < *(int *)(&this->field_0xb8 +
                                    (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
        }
        pLVar36 = this->activation;
        iVar33 = 0;
        if (pLVar36 != (Layer *)0x0) {
          (*pLVar36->_vptr_Layer[9])(pLVar36,local_1b0,local_168);
        }
      }
    }
  }
  else {
    local_188 = *(Allocator **)&opt->use_int8_arithmetic;
    ptr = *(void **)opt;
    uVar30._0_1_ = opt->use_winograd_convolution;
    uVar30._1_1_ = opt->use_sgemm_convolution;
    uVar30._2_1_ = opt->use_int8_inference;
    uVar30._3_1_ = opt->use_vulkan_compute;
    uVar7 = opt->use_fp16_packed;
    uVar8 = opt->use_fp16_storage;
    uVar10 = opt->use_fp16_arithmetic;
    uVar12 = opt->use_int8_storage;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar30._4_4_ = CONCAT31(uVar9,uVar7);
    local_198 = SUB84(opt->workspace_allocator,0);
    uStack_194 = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    iStack_190 = (int)uVar30;
    uStack_1a0 = SUB84(opt->workspace_allocator,0);
    uStack_19c = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var34 = pp_Var5[-3];
    uStack_18c = uVar30._4_4_;
    copy_make_border(&local_108,&local_238,*(int *)(&this->field_0xa4 + (long)p_Var34),
                     *(int *)(&this->field_0xa8 + (long)p_Var34),
                     *(int *)(&this->field_0x9c + (long)p_Var34),
                     *(int *)(&this->field_0xa0 + (long)p_Var34),0,
                     *(float *)(&this->field_0xac + (long)p_Var34),(Option *)&ptr);
    if ((local_238.data != (void *)0x0) && ((long)local_238.c * local_238.cstep != 0)) {
      iVar33 = local_238.w;
      iVar39 = local_238.h;
      goto LAB_0015f716;
    }
LAB_001603cb:
    iVar33 = -100;
  }
  if (local_238.refcount != (int *)0x0) {
    LOCK();
    *local_238.refcount = *local_238.refcount + -1;
    UNLOCK();
    if (*local_238.refcount == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00160404:
  if (local_108.refcount != (int *)0x0) {
    LOCK();
    *local_108.refcount = *local_108.refcount + -1;
    UNLOCK();
    if (*local_108.refcount == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;       
    }     

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                          
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                           
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_tm_g = top_blob_tm.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                

                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_tm_g = top_blob_tm.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
            }                 
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);                          
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }                        

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_g = top_blob.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                
              
                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
            }                       
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }          

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;
    
    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if (stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }
            else if (stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

         // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}